

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CECoordinates.cpp
# Opt level: O1

CECoordinates * __thiscall
CECoordinates::ConvertToObserved
          (CECoordinates *__return_storage_ptr__,CECoordinates *this,double jd,double longitude,
          double latitude,double elevation_m,double pressure_hPa,double temperature_celsius,
          double relative_humidity,double dut1,double xp,double yp,double wavelength_um)

{
  CECoordinateType CVar1;
  invalid_value *this_00;
  double *in_R8;
  double *in_R9;
  double ra;
  double dec;
  double ra_00;
  double dec_00;
  double glon;
  double glat;
  double ycoord_new;
  double xcoord_new;
  double apparent_y;
  double apparent_x;
  string msg;
  double apparent_hourangle;
  CECoordinateType local_c4;
  double local_c0;
  undefined1 local_b8 [48];
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  string local_60;
  string local_40;
  double local_20;
  
  local_b8._0_8_ = (_func_int **)0x0;
  local_c0 = 0.0;
  CVar1 = this->coord_type_;
  local_b8._8_8_ = dut1;
  local_b8._16_8_ = relative_humidity;
  local_b8._24_8_ = jd;
  local_b8._32_8_ = longitude;
  local_b8._40_8_ = latitude;
  local_88 = elevation_m;
  local_80 = pressure_hPa;
  local_78 = temperature_celsius;
  if (CVar1 == GALACTIC) {
    CppEphem::julian_date_J2000();
    (*this->_vptr_CECoordinates[5])(this);
    CppEphem::julian_date_J2000();
    (*this->_vptr_CECoordinates[7])(this);
    Galactic2Observed((CECoordinates *)local_b8,glon,glat,&local_c0,&local_68,
                      (double)local_b8._24_8_,(double)local_b8._32_8_,(double)local_b8._40_8_,
                      local_88,local_80,local_78,(double)local_b8._16_8_,(double)local_b8._8_8_,xp,
                      yp,wavelength_um,&local_70,in_R8,in_R9);
  }
  else if (CVar1 == ICRS) {
    CppEphem::julian_date_J2000();
    (*this->_vptr_CECoordinates[5])(this);
    CppEphem::julian_date_J2000();
    (*this->_vptr_CECoordinates[7])(this);
    ICRS2Observed((CECoordinates *)local_b8,ra_00,dec_00,&local_c0,&local_68,(double)local_b8._24_8_
                  ,(double)local_b8._32_8_,(double)local_b8._40_8_,local_88,local_80,local_78,
                  (double)local_b8._16_8_,(double)local_b8._8_8_,xp,yp,wavelength_um,&local_70,
                  &local_20,in_R9);
  }
  else {
    if (CVar1 != CIRS) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_40,"[ERROR] ",(allocator *)&local_60);
      __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_60);
      if (this->coord_type_ == OBSERVED) {
        std::__cxx11::string::operator+=
                  ((string *)&local_40,"Unable to convert to OBSERVED from OBSERVED");
      }
      this_00 = (invalid_value *)__cxa_allocate_exception(0xa8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_60,"CECoordinates::ConvertToObserved(long form)",
                 (allocator *)&local_c4);
      CEException::invalid_value::invalid_value(this_00,&local_60,&local_40);
      __cxa_throw(this_00,&CEException::invalid_value::typeinfo,
                  CEExceptionHandler::~CEExceptionHandler);
    }
    CppEphem::julian_date_J2000();
    (*this->_vptr_CECoordinates[5])(this);
    CppEphem::julian_date_J2000();
    (*this->_vptr_CECoordinates[7])(this);
    CIRS2Observed((CECoordinates *)local_b8,ra,dec,&local_c0,&local_68,(double)local_b8._24_8_,
                  (double)local_b8._32_8_,(double)local_b8._40_8_,local_88,local_80,local_78,
                  (double)local_b8._16_8_,(double)local_b8._8_8_,xp,yp,wavelength_um,&local_70,
                  &local_20,in_R9);
  }
  CEAngle::CEAngle((CEAngle *)&local_40,(double *)local_b8);
  CEAngle::CEAngle((CEAngle *)&local_60,&local_c0);
  local_c4 = OBSERVED;
  CECoordinates(__return_storage_ptr__,(CEAngle *)&local_40,(CEAngle *)&local_60,&local_c4);
  CEAngle::~CEAngle((CEAngle *)&local_60);
  CEAngle::~CEAngle((CEAngle *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

CECoordinates CECoordinates::ConvertToObserved(double jd,
                                double longitude,
                                double latitude,
                                double elevation_m,
                                double pressure_hPa,
                                double temperature_celsius,
                                double relative_humidity,
                                double dut1,
                                double xp, double yp,
                                double wavelength_um)
{
    double xcoord_new(0.0);
    double ycoord_new(0.0);
    double apparent_x, apparent_y, apparent_hourangle;
    if (coord_type_ == CECoordinateType::CIRS) {
        CIRS2Observed(XCoordinate_Rad(), YCoordinate_Rad(),
                      &xcoord_new, &ycoord_new,
                      jd,
                      longitude, latitude,
                      elevation_m, pressure_hPa,
                      temperature_celsius,
                      relative_humidity,
                      dut1, xp, yp,
                      wavelength_um,
                      &apparent_x, &apparent_y, &apparent_hourangle) ;
    } else if (coord_type_ == CECoordinateType::ICRS) {
        ICRS2Observed(XCoordinate_Rad(), YCoordinate_Rad(),
                      &xcoord_new, &ycoord_new,
                      jd,
                      longitude, latitude,
                      elevation_m, pressure_hPa,
                      temperature_celsius,
                      relative_humidity,
                      dut1, xp, yp,
                      wavelength_um,
                      &apparent_x, &apparent_y, &apparent_hourangle) ;
    } else if (coord_type_ == CECoordinateType::GALACTIC) {
        Galactic2Observed(XCoordinate_Rad(), YCoordinate_Rad(),
                      &xcoord_new, &ycoord_new,
                      jd,
                      longitude, latitude,
                      elevation_m, pressure_hPa,
                      temperature_celsius,
                      relative_humidity,
                      dut1, xp, yp,
                      wavelength_um,
                      &apparent_x, &apparent_y, &apparent_hourangle) ;
    } else {
        // Throw an exception
        std::string msg = "[ERROR] ";
        if (coord_type_ == CECoordinateType::OBSERVED) {
            // Cant convert from observed to observed without additional
            // observer information
            msg += "Unable to convert to OBSERVED from OBSERVED";
        }
        throw CEException::invalid_value("CECoordinates::ConvertToObserved(long form)",
                                         msg);
    }
 
    return CECoordinates(xcoord_new, ycoord_new, CECoordinateType::OBSERVED) ;
}